

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaModelGroupPtr
xmlSchemaAddModelGroup
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaTypeType type,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaParserCtxtPtr local_38;
  xmlSchemaModelGroupPtr ret;
  xmlNodePtr node_local;
  xmlSchemaTypeType type_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    local_38 = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x28);
    if (local_38 == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(ctxt);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(local_38,0,0x28);
      local_38->type = type;
      *(xmlNodePtr *)&local_38->err = node;
      if ((local_38 != (xmlSchemaParserCtxtPtr)0x0) &&
         (iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,local_38), iVar1 < 0))
      {
        xmlSchemaPErrMemory(ctxt);
        (*xmlFree)(local_38);
        local_38 = (xmlSchemaParserCtxtPtr)0x0;
      }
      if ((((type == XML_SCHEMA_TYPE_SEQUENCE) || (type == XML_SCHEMA_TYPE_CHOICE)) &&
          (local_38 != (xmlSchemaParserCtxtPtr)0x0)) &&
         (iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,local_38), iVar1 < 0)) {
        xmlSchemaPErrMemory(ctxt);
      }
      ctxt_local = local_38;
    }
  }
  return (xmlSchemaModelGroupPtr)ctxt_local;
}

Assistant:

static xmlSchemaModelGroupPtr
xmlSchemaAddModelGroup(xmlSchemaParserCtxtPtr ctxt,
		       xmlSchemaPtr schema,
		       xmlSchemaTypeType type,
		       xmlNodePtr node)
{
    xmlSchemaModelGroupPtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaModelGroupPtr)
	xmlMalloc(sizeof(xmlSchemaModelGroup));
    if (ret == NULL) {
	xmlSchemaPErrMemory(ctxt);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaModelGroup));
    ret->type = type;
    ret->node = node;
    WXS_ADD_LOCAL(ctxt, ret);
    if ((type == XML_SCHEMA_TYPE_SEQUENCE) ||
	(type == XML_SCHEMA_TYPE_CHOICE))
	WXS_ADD_PENDING(ctxt, ret);
    return (ret);
}